

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bijectionmap.h
# Opt level: O3

void __thiscall
Common::
BijectionMap<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::BijectionMap(BijectionMap<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this,initializer_list<std::pair<const_ICM::Instruction::Instruction,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *il)

{
  _Rb_tree_header *p_Var1;
  iterator ppVar2;
  iterator key;
  
  this->currcount = 0;
  p_Var1 = &(this->keymap)._M_t._M_impl.super__Rb_tree_header;
  (this->keymap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->keymap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->keymap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->keymap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->keymap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->valmap)._M_t._M_impl.super__Rb_tree_header;
  (this->valmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->valmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->valmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->valmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->valmap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->data).
  super__Vector_base<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data).
  super__Vector_base<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data).
  super__Vector_base<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->destroyable).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->destroyable).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->destroyable).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->destroyable).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->destroyable).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->destroyable).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->destroyable).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->destroyable).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->destroyable).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->destroyable).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map
            (&(this->destroyable).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>,0
            );
  if (il->_M_len != 0) {
    key = il->_M_array;
    ppVar2 = key + il->_M_len;
    do {
      insert(this,&key->first,&key->second);
      key = key + 1;
    } while (key != ppVar2);
  }
  return;
}

Assistant:

BijectionMap(const std::initializer_list<value_type> &il) {
		for (const value_type &e : il)
			insert(e.first, e.second);
	}